

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::colSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  uint *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int p_col;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  pointer pnVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  long lVar20;
  int *piVar21;
  long lVar22;
  int *piVar23;
  int *piVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  int *piVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  iVar25 = (this->temp).stage;
  if (0 < iVar25) {
    piVar5 = (this->row).orig;
    piVar6 = (this->row).perm;
    piVar7 = (this->temp).s_mark;
    lVar30 = 0;
    piVar23 = (this->u).row.idx;
    do {
      iVar3 = piVar5[lVar30];
      lVar35 = (long)(this->u).row.len[iVar3];
      piVar24 = piVar23;
      if (0 < lVar35) {
        iVar25 = (this->u).row.start[iVar3];
        lVar34 = 0;
        do {
          p_col = piVar23[iVar25 + lVar34];
          piVar8 = (this->u).col.idx;
          piVar9 = (this->u).col.start;
          piVar10 = (this->u).col.len;
          piVar11 = (this->temp).s_cact;
          iVar31 = (piVar10[p_col] + piVar9[p_col]) - piVar11[p_col];
          piVar21 = piVar8 + iVar31;
          do {
            piVar32 = piVar21;
            piVar21 = piVar32 + 1;
          } while (*piVar32 != iVar3);
          *piVar32 = piVar8[iVar31];
          piVar8[iVar31] = iVar3;
          iVar31 = piVar11[p_col];
          piVar11[p_col] = iVar31 + -1;
          if (iVar31 == 2) {
            iVar31 = piVar10[p_col];
            piVar10[p_col] = iVar31 + -1;
            iVar31 = piVar8[(long)piVar9[p_col] + (long)iVar31 + -1];
            if (-1 < piVar6[iVar31]) goto LAB_003e09a5;
            piVar8 = (this->u).row.len;
            iVar29 = piVar8[iVar31] + -1;
            iVar4 = (this->u).row.start[iVar31];
            piVar8[iVar31] = iVar29;
            lVar26 = (long)(iVar4 + iVar29);
            lVar27 = lVar26 * 4 + 4;
            lVar22 = lVar26 * 0x50 + 0x98;
            do {
              lVar33 = lVar22;
              lVar28 = lVar27 + -4;
              lVar20 = lVar27 + -4;
              lVar27 = lVar28;
              lVar22 = lVar33 + -0x50;
            } while (*(int *)((long)piVar24 + lVar20) != p_col);
            pnVar12 = (this->u).row.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar1 = (uint *)((long)pnVar12[-2].m_backend.data._M_elems + lVar33 + 8);
            local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
            local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)pnVar12[-2].m_backend.data._M_elems + lVar33 + 0x18);
            local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)pnVar12[-2].m_backend.data._M_elems + lVar33 + 0x28);
            local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
            local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)pnVar12[-2].m_backend.data._M_elems + lVar33 + 0x38);
            local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
            local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
            local_88.m_backend.exp = *(int *)((long)(&pnVar12[-2].m_backend.data + 1) + 8U + lVar33)
            ;
            local_88.m_backend.neg =
                 *(bool *)((long)(&pnVar12[-2].m_backend.data + 1) + 0xcU + lVar33);
            local_88.m_backend._72_8_ =
                 *(undefined8 *)((long)pnVar12[-1].m_backend.data._M_elems + lVar33);
            setPivot(this,(this->temp).stage,p_col,iVar31,&local_88);
            iVar31 = (this->temp).stage;
            (this->temp).stage = iVar31 + 1;
            piVar7[iVar31] = p_col;
            pnVar12 = (this->u).row.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar13 = *(undefined8 *)pnVar12[lVar26].m_backend.data._M_elems;
            uVar14 = *(undefined8 *)((long)pnVar12[lVar26].m_backend.data._M_elems + 8);
            puVar1 = (uint *)((long)pnVar12[lVar26].m_backend.data._M_elems + 0x10);
            uVar15 = *(undefined8 *)puVar1;
            uVar16 = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)pnVar12[lVar26].m_backend.data._M_elems + 0x20);
            uVar17 = *(undefined8 *)puVar1;
            uVar18 = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)pnVar12[lVar26].m_backend.data._M_elems + 0x30);
            uVar19 = *(undefined8 *)(puVar1 + 2);
            puVar2 = (undefined8 *)((long)pnVar12[-2].m_backend.data._M_elems + lVar33 + 0x38);
            *puVar2 = *(undefined8 *)puVar1;
            puVar2[1] = uVar19;
            puVar2 = (undefined8 *)((long)pnVar12[-2].m_backend.data._M_elems + lVar33 + 0x28);
            *puVar2 = uVar17;
            puVar2[1] = uVar18;
            puVar2 = (undefined8 *)((long)pnVar12[-2].m_backend.data._M_elems + lVar33 + 0x18);
            *puVar2 = uVar15;
            puVar2[1] = uVar16;
            puVar2 = (undefined8 *)((long)pnVar12[-2].m_backend.data._M_elems + lVar33 + 8);
            *puVar2 = uVar13;
            puVar2[1] = uVar14;
            *(int *)((long)(&pnVar12[-2].m_backend.data + 1) + 8U + lVar33) =
                 pnVar12[lVar26].m_backend.exp;
            *(bool *)((long)(&pnVar12[-2].m_backend.data + 1) + 0xcU + lVar33) =
                 pnVar12[lVar26].m_backend.neg;
            *(undefined8 *)((long)pnVar12[-1].m_backend.data._M_elems + lVar33) =
                 *(undefined8 *)&pnVar12[lVar26].m_backend.fpclass;
            piVar24 = (this->u).row.idx;
            *(int *)((long)piVar24 + lVar28) = piVar24[lVar26];
          }
          else if (iVar31 == 1) {
LAB_003e09a5:
            this->stat = SINGULAR;
            return;
          }
          lVar34 = lVar34 + 1;
        } while (lVar34 != lVar35);
        iVar25 = (this->temp).stage;
      }
      lVar30 = lVar30 + 1;
      piVar23 = piVar24;
    } while (lVar30 < iVar25);
  }
  return;
}

Assistant:

void CLUFactor<R>::colSingletons()
{
   int i, j, k, n;
   int len;
   int p_col, p_row, newrow;
   int* idx;
   int* rorig = row.orig;
   int* rperm = row.perm;
   int* sing = temp.s_mark;


   /*  Iteratively update column counts due to removed column singletons
    *  thereby removing new arising columns singletons
    *  and computing the index of the first row singleton (-1)
    *  until no more can be found.
    */

   for(i = 0; i < temp.stage; ++i)
   {
      p_row = rorig[i];
      assert(p_row >= 0);
      idx = &(u.row.idx[u.row.start[p_row]]);
      len = u.row.len[p_row];

      for(j = 0; j < len; ++j)
      {
         /*  Move pivotal nonzeros to front of column.
          */
         p_col = idx[j];
         assert(temp.s_cact[p_col] > 0);

         n = u.col.start[p_col] + u.col.len[p_col] - temp.s_cact[p_col];

         for(k = n; u.col.idx[k] != p_row; ++k)
            ;

         assert(k < u.col.start[p_col] + u.col.len[p_col]);

         u.col.idx[k] = u.col.idx[n];

         u.col.idx[n] = p_row;

         n = --(temp.s_cact[p_col]);          /* column nonzeros of ACTIVE matrix */

         if(n == 1)                   /* Here is another singleton */
         {
            newrow = u.col.idx[--u.col.len[p_col] + u.col.start[p_col]];

            /*      Ensure, matrix not singular
             */

            if(rperm[newrow] >= 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }

            /*      Find singleton in row.
             */
            n = u.row.start[newrow] + (--(u.row.len[newrow]));

            for(k = n; u.row.idx[k] != p_col; --k)
               ;

            /*      Remove singleton from column.
             */
            setPivot(temp.stage, p_col, newrow, u.row.val[k]);

            sing[temp.stage++] = p_col;

            /*      Move pivot element to diag.
             */
            u.row.val[k] = u.row.val[n];

            u.row.idx[k] = u.row.idx[n];
         }
         else if(n == 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }
      }
   }

   assert(temp.stage <= thedim);
}